

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

void __thiscall flatbuffers::FlatBufferBuilderImpl<false>::Clear(FlatBufferBuilderImpl<false> *this)

{
  _Rb_tree_header *p_Var1;
  uint8_t *puVar2;
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  *this_00;
  uint8_t *puVar3;
  
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  puVar2 = (this->buf_).buf_;
  if (puVar2 == (uint8_t *)0x0) {
    (this->buf_).reserved_ = 0;
    puVar3 = (uint8_t *)0x0;
  }
  else {
    puVar3 = puVar2 + (this->buf_).reserved_;
  }
  (this->buf_).cur_ = puVar3;
  (this->buf_).size_ = 0;
  (this->buf_).scratch_ = puVar2;
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->length_of_64_bit_region_ = 0;
  this_00 = &this->string_pool->_M_t;
  if (this_00 ==
      (_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
       *)0x0) {
    return;
  }
  std::
  _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  ::_M_erase(this_00,(_Link_type)(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent);
  p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this_00->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this_00->_M_impl).super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void ClearOffsets() {
    buf_.scratch_pop(num_field_loc * sizeof(FieldLoc));
    num_field_loc = 0;
    max_voffset_ = 0;
  }